

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O2

MMDB_entry_data_list_s * test_uint32_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x11c,(pMVar1->entry_data).type,"==",6,"\'uint32\' key\'s value is an uint32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x11e,(pMVar1->entry_data).field_1.int32,"==",0x10000000,"uint32 field is 100",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_uint32_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT32,
           "'uint32' key's value is an uint32");
    uint32_t expect = 1 << 28;
    cmp_ok(value->entry_data.uint32, "==", expect, "uint32 field is 100");

    return entry_data_list;
}